

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

void waitkey(void)

{
  int iVar1;
  int c;
  
  if (debuginfo != '\0') {
    iVar1 = getchar();
    switch(iVar1) {
    case 0x69:
      irq();
      break;
    case 0x72:
      debuginfo = '\0';
      break;
    case 0x73:
      show_screen();
      break;
    case 0x78:
      (*decode[0xff])();
    }
  }
  return;
}

Assistant:

void waitkey(void) {
    int c;
    if (debuginfo)             // Check if debugging is enabled
    {
        c = getchar();
        switch (c) {
            case 'i':
                irq();
                break;           // if "I" is pressed, generated an IRQ
            case 'r':
                debuginfo = 0;
                break;      // turn off debugging and run freely
            case 's':
                show_screen();
                break;   // if "s", display a mode 7 screen
            case 'x':
                decode[0xFF]();
                break;  // if "x", exit!
        }
    }
}